

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

typed_option<std::vector<double,_std::allocator<double>_>_> * __thiscall
VW::config::typed_option<std::vector<double,_std::allocator<double>_>_>::value
          (typed_option<std::vector<double,_std::allocator<double>_>_> *this,
          vector<double,_std::allocator<double>_> *value)

{
  __shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::
  make_shared<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>&>
            ((vector<double,_std::allocator<double>_> *)&local_20);
  std::__shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>::
  operator=(&(this->m_value).
             super___shared_ptr<std::vector<double,_std::allocator<double>_>,_(__gnu_cxx::_Lock_policy)2>
            ,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return this;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }